

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void window_size_suite::window_1(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin;
  void *pvVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_03;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_04;
  reference piVar3;
  ulong uVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_1UL> array;
  allocator_type local_d9;
  vector<int,_std::allocator<int>_> local_d8;
  int local_bc;
  circular_view<int,_18446744073709551615UL> local_b8;
  type local_94;
  view_pointer local_90;
  size_type sStack_88;
  view_pointer local_80;
  size_type sStack_78;
  view_pointer local_70;
  size_type sStack_68;
  view_pointer local_60;
  size_type sStack_58;
  circular_view<int,_18446744073709551615UL> *local_50;
  size_type sStack_48;
  circular_view<int,_18446744073709551615UL> *local_40;
  size_type sStack_38;
  
  local_b8.member.data = &local_94;
  local_94 = 0;
  local_b8.member.cap = 1;
  local_b8.member.size = 0;
  local_b8.member.next = 1;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_b8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  *piVar3 = 1;
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::front(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ce,"void window_size_suite::window_1()",piVar3,&local_d8);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9cf,"void window_size_suite::window_1()",piVar3,&local_d8);
  local_bc = 1;
  __l._M_len = 1;
  __l._M_array = &local_bc;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l,&local_d9);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar4 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_38 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar4 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_38 = local_b8.member.next % uVar1;
  }
  second_begin._M_current._4_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin._M_current._0_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  first_end.current = sStack_38;
  first_end.parent = &local_b8;
  first_begin.current = uVar4;
  first_begin.parent = &local_b8;
  local_40 = &local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9d2,"void window_size_suite::window_1()",first_begin,first_end,second_begin,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  pvVar2 = (void *)CONCAT44(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_b8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  *piVar3 = 2;
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::front(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9d6,"void window_size_suite::window_1()",piVar3,&local_d8);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9d7,"void window_size_suite::window_1()",piVar3,&local_d8);
  local_bc = 2;
  __l_00._M_len = 1;
  __l_00._M_array = &local_bc;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l_00,&local_d9);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar4 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_48 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar4 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_48 = local_b8.member.next % uVar1;
  }
  second_begin_00._M_current._4_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin_00._M_current._0_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  first_end_00.current = sStack_48;
  first_end_00.parent = &local_b8;
  first_begin_00.current = uVar4;
  first_begin_00.parent = &local_b8;
  local_50 = &local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9da,"void window_size_suite::window_1()",first_begin_00,first_end_00,second_begin_00
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish);
  pvVar2 = (void *)CONCAT44(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_b8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  *piVar3 = 3;
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::front(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9de,"void window_size_suite::window_1()",piVar3,&local_d8);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9df,"void window_size_suite::window_1()",piVar3,&local_d8);
  local_bc = 3;
  __l_01._M_len = 1;
  __l_01._M_array = &local_bc;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l_01,&local_d9);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar4 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_58 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar4 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_58 = local_b8.member.next % uVar1;
  }
  local_60 = &local_b8;
  second_begin_01._M_current._4_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin_01._M_current._0_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  first_end_01.current = sStack_58;
  first_end_01.parent = local_60;
  first_begin_01.current = uVar4;
  first_begin_01.parent = local_60;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9e2,"void window_size_suite::window_1()",first_begin_01,first_end_01,second_begin_01
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish);
  pvVar2 = (void *)CONCAT44(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_b8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  *piVar3 = 4;
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::front(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9e6,"void window_size_suite::window_1()",piVar3,&local_d8);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9e7,"void window_size_suite::window_1()",piVar3,&local_d8);
  local_bc = 4;
  __l_02._M_len = 1;
  __l_02._M_array = &local_bc;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l_02,&local_d9);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar4 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_68 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar4 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_68 = local_b8.member.next % uVar1;
  }
  local_70 = &local_b8;
  second_begin_02._M_current._4_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin_02._M_current._0_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  first_end_02.current = sStack_68;
  first_end_02.parent = local_70;
  first_begin_02.current = uVar4;
  first_begin_02.parent = local_70;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ea,"void window_size_suite::window_1()",first_begin_02,first_end_02,second_begin_02
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish);
  pvVar2 = (void *)CONCAT44(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_b8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  *piVar3 = 5;
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::front(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ee,"void window_size_suite::window_1()",piVar3,&local_d8);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ef,"void window_size_suite::window_1()",piVar3,&local_d8);
  local_bc = 5;
  __l_03._M_len = 1;
  __l_03._M_array = &local_bc;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l_03,&local_d9);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar4 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_78 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar4 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_78 = local_b8.member.next % uVar1;
  }
  local_80 = &local_b8;
  second_begin_03._M_current._4_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin_03._M_current._0_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  first_end_03.current = sStack_78;
  first_end_03.parent = local_80;
  first_begin_03.current = uVar4;
  first_begin_03.parent = local_80;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9f2,"void window_size_suite::window_1()",first_begin_03,first_end_03,second_begin_03
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish);
  pvVar2 = (void *)CONCAT44(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_b8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  *piVar3 = 6;
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::front(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 6;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","6",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9f6,"void window_size_suite::window_1()",piVar3,&local_d8);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 6;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","6",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9f7,"void window_size_suite::window_1()",piVar3,&local_d8);
  local_bc = 6;
  __l_04._M_len = 1;
  __l_04._M_array = &local_bc;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l_04,&local_d9);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar4 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_88 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar4 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_88 = local_b8.member.next % uVar1;
  }
  local_90 = &local_b8;
  second_begin_04._M_current._4_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin_04._M_current._0_4_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  first_end_04.current = sStack_88;
  first_end_04.parent = local_90;
  first_begin_04.current = uVar4;
  first_begin_04.parent = local_90;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9fa,"void window_size_suite::window_1()",first_begin_04,first_end_04,second_begin_04
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish);
  pvVar2 = (void *)CONCAT44(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  return;
}

Assistant:

void window_1()
{
    std::array<int, 1> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(1);
    {
        BOOST_TEST_EQ(span.front(), 1);
        BOOST_TEST_EQ(span.back(), 1);
        std::vector<int> expect = { 1 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(2);
    {
        BOOST_TEST_EQ(span.front(), 2);
        BOOST_TEST_EQ(span.back(), 2);
        std::vector<int> expect = { 2 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(3);
    {
        BOOST_TEST_EQ(span.front(), 3);
        BOOST_TEST_EQ(span.back(), 3);
        std::vector<int> expect = { 3 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(4);
    {
        BOOST_TEST_EQ(span.front(), 4);
        BOOST_TEST_EQ(span.back(), 4);
        std::vector<int> expect = { 4 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(5);
    {
        BOOST_TEST_EQ(span.front(), 5);
        BOOST_TEST_EQ(span.back(), 5);
        std::vector<int> expect = { 5 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(6);
    {
        BOOST_TEST_EQ(span.front(), 6);
        BOOST_TEST_EQ(span.back(), 6);
        std::vector<int> expect = { 6 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}